

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

void setupMain(void)

{
  object *proc;
  object *poVar1;
  object *poVar2;
  typeDesc *ptVar3;
  typeDesc *ptVar4;
  
  proc = newAnonymousObj(0x2c0);
  stringCopy("main",proc->name);
  proc->retTypeIndex = intTypeIndex;
  proc->hasPrototype = 1;
  proc->hasArguments = 1;
  openScope();
  poVar2 = topScope;
  poVar1 = (object *)calloc(1,0x90);
  stringCopy("argc",poVar1->name);
  poVar1->typeIndex = intTypeIndex;
  poVar1->next = poVar2->next;
  poVar2->next = poVar1;
  poVar1->cl = 0x2c1;
  poVar1->val = 0x14;
  poVar1->lev = 1;
  poVar2 = (object *)calloc(1,0x90);
  stringCopy("argv",poVar2->name);
  ptVar3 = newType();
  ptVar3->form = 0x322;
  ptVar4 = getType(charTypeIndex);
  ptVar3->base = ptVar4;
  ptVar3->size = 0xc;
  poVar2->typeIndex = ptVar3->index;
  poVar2->cl = 0x2c5;
  poVar2->next = poVar1->next;
  poVar1->next = poVar2;
  poVar2->val = 8;
  poVar2->lev = 1;
  addProcToFixList(5,proc);
  proc->dsc = topScope;
  topScope = topScope->dsc;
  return;
}

Assistant:

procedure
void setupMain(void) {
	variable struct object *proc; variable struct object *firstParam; 
	variable struct object *secondParam; variable struct object *it;
	variable struct typeDesc *tp; variable struct typeDesc *type;
	proc = newAnonymousObj(CLASS_PROC);
	stringCopy("main",proc->name);
	proc->retTypeIndex = intTypeIndex;
	proc->hasArguments = true;
	proc->hasPrototype = true;

	openScope();
	it = topScope;

	/* setup argc */
	allocMem(firstParam);
	stringCopy("argc", firstParam->name);
	firstParam->typeIndex = intTypeIndex;
	firstParam->next = it->next; it->next = firstParam;
	firstParam->cl = CLASS_VAR; /* value */
	firstParam->lev = 1; /* local */
	firstParam->val = 20;
	it = it->next;

	/* setup argv */
	allocMem(secondParam);
	stringCopy("argv", secondParam->name);
	tp = newType();
	tp->form = FORM_ARRAY;
	type = getType(charTypeIndex);
	tp->base = type;
	tp->size = wordSize + 8;
	secondParam->typeIndex = tp->index;
	secondParam->cl = CLASS_PAR; 
	secondParam->next = it->next; it->next = secondParam;
	secondParam->lev = 1;
	secondParam->val = 8;
	it = it->next;
	
	addProcToFixList(ENTRY,proc);

	/* set dsc to HEAD of inner scope */
	proc->dsc = topScope;
	closeScope();
	

}